

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O2

Fxu_Matrix * Fxu_CreateMatrix(Fxu_Data_t *pData)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Fxu_Matrix *p;
  Fxu_Var **ppFVar8;
  Fxu_Var *pFVar9;
  Fxu_Pair ***pppFVar10;
  Fxu_Pair **__s;
  int *__ptr;
  Fxu_Cube *pFVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Fxu_Cube *pCube1;
  int i;
  uint uVar16;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  long lVar20;
  uint local_5c;
  
  uVar6 = 0xffffffff;
  uVar16 = 0;
  local_5c = 0;
  uVar14 = 0;
  for (lVar20 = 0; lVar20 < pData->nNodesOld; lVar20 = lVar20 + 1) {
    pcVar19 = (char *)pData->vSops->pArray[lVar20];
    if (pcVar19 != (char *)0x0) {
      iVar3 = Abc_SopGetCubeNum(pcVar19);
      uVar4 = Abc_SopGetVarNum(pcVar19);
      if (((int)uVar4 < 2) || (iVar3 < 1)) {
        __assert_fail("nFanins > 1 && nCubes > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                      ,0x50,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
      }
      uVar16 = uVar16 + iVar3;
      local_5c = local_5c + ((uint)((iVar3 + -1) * iVar3) >> 1);
      uVar14 = iVar3 * iVar3 + uVar14;
      if ((int)uVar6 <= (int)uVar4) {
        uVar6 = uVar4;
      }
    }
  }
  if ((int)uVar6 < 1) {
    pcVar19 = "The current network does not have SOPs to perform extraction.";
  }
  else {
    if (50000000 < (int)uVar14) {
      printf("The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n",
             (ulong)uVar16,(ulong)uVar14);
      return (Fxu_Matrix *)0x0;
    }
    p = Fxu_MatrixAllocate();
    uVar15 = (ulong)pData->nNodesOld;
    ppFVar8 = (Fxu_Var **)malloc(((long)pData->nNodesExt + uVar15) * 0x10);
    p->ppVars = ppFVar8;
    for (lVar20 = 0; lVar20 < (int)uVar15 * 2; lVar20 = lVar20 + 1) {
      pFVar9 = Fxu_MatrixAddVar(p);
      p->ppVars[lVar20] = pFVar9;
      uVar15 = (ulong)(uint)pData->nNodesOld;
    }
    pppFVar10 = (Fxu_Pair ***)malloc((ulong)uVar16 * 8 + 800);
    p->pppPairs = pppFVar10;
    __s = (Fxu_Pair **)malloc((ulong)uVar14 * 8 + 800);
    p->ppPairs = __s;
    memset(__s,0,(ulong)uVar14 * 8);
    uVar4 = 0;
    uVar18 = 0;
    for (lVar20 = 0; lVar20 < (int)uVar15; lVar20 = lVar20 + 1) {
      pcVar19 = (char *)pData->vSops->pArray[lVar20];
      if (pcVar19 != (char *)0x0) {
        uVar5 = Abc_SopGetCubeNum(pcVar19);
        pFVar9 = p->ppVars[lVar20 * 2 + 1];
        pFVar9->nCubes = uVar5;
        if (0 < (int)uVar5) {
          pppFVar10 = p->pppPairs;
          pFVar9->ppPairs = pppFVar10 + (int)uVar4;
          pppFVar10[(int)uVar4] = p->ppPairs + (int)uVar18;
          for (uVar15 = 1; uVar5 != uVar15; uVar15 = uVar15 + 1) {
            pFVar9->ppPairs[uVar15] = pFVar9->ppPairs[uVar15 - 1] + uVar5;
          }
        }
        uVar4 = uVar4 + uVar5;
        uVar18 = uVar18 + uVar5 * uVar5;
        uVar15 = (ulong)(uint)pData->nNodesOld;
      }
    }
    if (uVar4 != uVar16) {
      __assert_fail("iCube == nCubesTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                    ,0x85,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
    }
    if (uVar18 != uVar14) {
      __assert_fail("iPair == nPairsStore",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                    ,0x86,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
    }
    __ptr = (int *)malloc((ulong)uVar6 << 2);
    for (lVar20 = 0; lVar20 < (int)uVar15; lVar20 = lVar20 + 1) {
      pcVar19 = (char *)pData->vSops->pArray[lVar20];
      if (pcVar19 != (char *)0x0) {
        pFVar9 = p->ppVars[lVar20 * 2 + 1];
        pvVar2 = pData->vFanins->pArray[lVar20];
        s_pLits = *(int **)((long)pvVar2 + 8);
        uVar6 = Abc_SopGetVarNum(pcVar19);
        uVar15 = 0;
        if (0 < (int)uVar6) {
          uVar15 = (ulong)uVar6;
        }
        for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
          __ptr[uVar13] = (int)uVar13;
        }
        qsort(__ptr,(long)(int)uVar6,4,Fxu_CreateMatrixLitCompare);
        if (s_pLits[__ptr[(long)(int)uVar6 - 1]] <= s_pLits[*__ptr]) {
          __assert_fail("s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                        ,0x9c,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
        }
        pCube1 = (Fxu_Cube *)0x0;
        iVar3 = 0;
        for (; *pcVar19 != '\0'; pcVar19 = pcVar19 + (int)(uVar6 + 3)) {
          pFVar11 = Fxu_MatrixAddCube(p,pFVar9,iVar3);
          for (lVar17 = 0; (pcVar19[lVar17] & 0xdfU) != 0; lVar17 = lVar17 + 1) {
            lVar12 = (long)__ptr[lVar17];
            if (pcVar19[lVar12] == '1') {
              iVar7 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar12 * 4) * 2;
LAB_003bd002:
              Fxu_MatrixAddLiteral(p,pFVar11,p->ppVars[iVar7]);
            }
            else if (pcVar19[lVar12] == '0') {
              iVar7 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar12 * 4) * 2 + 1;
              goto LAB_003bd002;
            }
          }
          if (pCube1 == (Fxu_Cube *)0x0) {
            pCube1 = pFVar11;
          }
          pFVar11->pFirst = pCube1;
          iVar3 = iVar3 + 1;
        }
        pFVar9->pFirst = pCube1;
        if ((int)local_5c <= pData->nPairsMax) {
          for (; pFVar11 = pCube1, pCube1 != (Fxu_Cube *)0x0; pCube1 = pCube1->pNext) {
            while (pFVar11 = pFVar11->pNext, pFVar11 != (Fxu_Cube *)0x0) {
              Fxu_MatrixAddDivisor(p,pCube1,pFVar11);
            }
          }
        }
      }
      uVar15 = (ulong)(uint)pData->nNodesOld;
    }
    free(__ptr);
    if ((int)local_5c < 0x989681) {
      if ((pData->nPairsMax < (int)local_5c) &&
         (iVar3 = Fxu_PreprocessCubePairs(p,pData->vSops,local_5c,pData->nPairsMax), iVar3 == 0)) {
        return (Fxu_Matrix *)0x0;
      }
      if ((p->lVars).nItems < 0xf4241) {
        Fxu_MatrixComputeSingles(p,pData->fUse0,pData->nSingleMax);
        if (pData->fVerbose != 0) {
          iVar3 = p->nEntries;
          iVar7 = (p->lCubes).nItems;
          iVar1 = (p->lVars).nItems;
          fprintf(_stdout,"Matrix: [vars x cubes] = [%d x %d]  ");
          fprintf(_stdout,"Lits = %d  Density = %.5f%%\n",
                  ((double)iVar3 / (double)iVar1) / (double)iVar7,(ulong)(uint)p->nEntries);
          fprintf(_stdout,"1-cube divs = %6d. (Total = %6d)  ",(ulong)(uint)(p->lSingles).nItems,
                  (ulong)(uint)p->nSingleTotal);
          fprintf(_stdout,"2-cube divs = %6d. (Total = %6d)",(ulong)(uint)p->nDivsTotal,
                  (ulong)local_5c);
          fputc(10,_stdout);
          return p;
        }
        return p;
      }
      pcVar19 = "The total number of variables is more than 1,000,000.";
    }
    else {
      pcVar19 = "The total number of cube pairs of the network is more than 10,000,000.";
    }
    puts(pcVar19);
    puts("Command \"fx\" takes a long time to run in such cases. It is suggested");
    puts("that the user changes the network by reducing the size of logic node and");
    puts("consequently the number of cube pairs to be processed by this command.");
    puts("It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"");
    pcVar19 = "as a proprocessing step, while selecting <num> as approapriate.";
  }
  puts(pcVar19);
  return (Fxu_Matrix *)0x0;
}

Assistant:

Fxu_Matrix * Fxu_CreateMatrix( Fxu_Data_t * pData )
{
    Fxu_Matrix * p;
    Fxu_Var * pVar;
    Fxu_Cube * pCubeFirst, * pCubeNew;
    Fxu_Cube * pCube1, * pCube2;
    Vec_Int_t * vFanins;
    char * pSopCover;
    char * pSopCube;
    int * pOrder, nBitsMax;
    int i, v, c;
    int nCubesTotal;
    int nPairsTotal;
    int nPairsStore;
    int nCubes;
    int iCube, iPair;
    int nFanins;

    // collect all sorts of statistics
    nCubesTotal =  0;
    nPairsTotal =  0;
    nPairsStore =  0;
    nBitsMax    = -1; 
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            nCubes       = Abc_SopGetCubeNum( pSopCover );
            nFanins      = Abc_SopGetVarNum( pSopCover );
            assert( nFanins > 1 && nCubes > 0 );

            nCubesTotal += nCubes;
            nPairsTotal += nCubes * (nCubes - 1) / 2;
            nPairsStore += nCubes * nCubes;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    if ( nBitsMax <= 0 )
    {
        printf( "The current network does not have SOPs to perform extraction.\n" );
        return NULL;
    }

    if ( nPairsStore > 50000000 )
    {
        printf( "The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n", nCubesTotal, nPairsStore );
        return NULL;
    }

    // start the matrix
	p = Fxu_MatrixAllocate();
    // create the column labels 
    p->ppVars = ABC_ALLOC( Fxu_Var *, 2 * (pData->nNodesOld + pData->nNodesExt) );
    for ( i = 0; i < 2 * pData->nNodesOld; i++ )
        p->ppVars[i] = Fxu_MatrixAddVar( p );

    // allocate storage for all cube pairs at once
    p->pppPairs = ABC_ALLOC( Fxu_Pair **, nCubesTotal + 100 );
    p->ppPairs  = ABC_ALLOC( Fxu_Pair *,  nPairsStore + 100 );
    memset( p->ppPairs, 0, sizeof(Fxu_Pair *) * nPairsStore );
    iCube = 0;
    iPair = 0;
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            // get the number of cubes
            nCubes = Abc_SopGetCubeNum( pSopCover );
            // get the new var in the matrix
            pVar = p->ppVars[2*i+1];
            // assign the pair storage
            pVar->nCubes     = nCubes;
            if ( nCubes > 0 )
            {
                pVar->ppPairs    = p->pppPairs + iCube;
                pVar->ppPairs[0] = p->ppPairs  + iPair;
                for ( v = 1; v < nCubes; v++ )
                    pVar->ppPairs[v] = pVar->ppPairs[v-1] + nCubes;
            }
            // update
            iCube += nCubes;
            iPair += nCubes * nCubes;
        }
    assert( iCube == nCubesTotal );
    assert( iPair == nPairsStore );


    // allocate room for the reordered literals
    pOrder = ABC_ALLOC( int, nBitsMax );
    // create the rows
    for ( i = 0; i < pData->nNodesOld; i++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
    {
        // get the new var in the matrix
        pVar = p->ppVars[2*i+1];
        // here we sort the literals of the cover
        // in the increasing order of the numbers of the corresponding nodes
        // because literals should be added to the matrix in this order
        vFanins = (Vec_Int_t *)pData->vFanins->pArray[i];
        s_pLits = vFanins->pArray;
        // start the variable order
        nFanins = Abc_SopGetVarNum( pSopCover );
        for ( v = 0; v < nFanins; v++ )
            pOrder[v] = v;
        // reorder the fanins
        qsort( (void *)pOrder, nFanins, sizeof(int),(int (*)(const void *, const void *))Fxu_CreateMatrixLitCompare);
        assert( s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ] );
        // create the corresponding cubes in the matrix
        pCubeFirst = NULL;
        c = 0;
        Abc_SopForEachCube( pSopCover, nFanins, pSopCube )
        {
            // create the cube
	        pCubeNew = Fxu_MatrixAddCube( p, pVar, c++ );
            Fxu_CreateMatrixAddCube( p, pCubeNew, pSopCube, vFanins, pOrder );
            if ( pCubeFirst == NULL )
                pCubeFirst = pCubeNew;
            pCubeNew->pFirst = pCubeFirst;
        }
        // set the first cube of this var
        pVar->pFirst = pCubeFirst;
        // create the divisors without preprocessing
        if ( nPairsTotal <= pData->nPairsMax )
        {
		    for ( pCube1 = pCubeFirst; pCube1; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1? pCube1->pNext: NULL; pCube2; pCube2 = pCube2->pNext )
				    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
        }
    }
    ABC_FREE( pOrder );

    // consider the case when cube pairs should be preprocessed
    // before adding them to the set of divisors
//    if ( pData->fVerbose )
//        printf( "The total number of cube pairs is %d.\n", nPairsTotal );
    if ( nPairsTotal > 10000000 )
    {
        printf( "The total number of cube pairs of the network is more than 10,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }
    if ( nPairsTotal > pData->nPairsMax )
        if ( !Fxu_PreprocessCubePairs( p, pData->vSops, nPairsTotal, pData->nPairsMax ) )
            return NULL;
//    if ( pData->fVerbose )
//        printf( "Only %d best cube pairs will be used by the fast extract command.\n", pData->nPairsMax );

    if ( p->lVars.nItems > 1000000 )
    {
        printf( "The total number of variables is more than 1,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }


    // add the var pairs to the heap
    Fxu_MatrixComputeSingles( p, pData->fUse0, pData->nSingleMax );

    // print stats
    if ( pData->fVerbose )
    {
        double Density;
        Density = ((double)p->nEntries) / p->lVars.nItems / p->lCubes.nItems;
	    fprintf( stdout, "Matrix: [vars x cubes] = [%d x %d]  ",
            p->lVars.nItems, p->lCubes.nItems );
	    fprintf( stdout, "Lits = %d  Density = %.5f%%\n", 
            p->nEntries, Density );
	    fprintf( stdout, "1-cube divs = %6d. (Total = %6d)  ",  p->lSingles.nItems, p->nSingleTotal );
	    fprintf( stdout, "2-cube divs = %6d. (Total = %6d)",  p->nDivsTotal, nPairsTotal );
	    fprintf( stdout, "\n" );
    }
//    Fxu_MatrixPrint( stdout, p );
    return p;
}